

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleMake(TranslateToFuzzReader *this,Type type)

{
  char cVar1;
  Type *pTVar2;
  uintptr_t *puVar3;
  TupleMake *pTVar4;
  Expression *local_70;
  undefined1 auStack_68 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elements;
  uintptr_t local_48;
  Type type_local;
  Iterator __begin1;
  
  local_48 = type.id;
  if (((byte)this->wasm[0x109] & 2) == 0) {
    __assert_fail("wasm.features.hasMultivalue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x611,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  cVar1 = wasm::Type::isTuple();
  if (cVar1 != '\0') {
    auStack_68 = (undefined1  [8])0x0;
    elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    type_local.id = (uintptr_t)&local_48;
    pTVar2 = (Type *)wasm::Type::size();
    if (pTVar2 != (Type *)0x0) {
      do {
        do {
          puVar3 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)&type_local);
          local_70 = make(this,(Type)*puVar3);
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_68,
                     &local_70);
          __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                 != pTVar2);
      } while ((uintptr_t *)type_local.id != &local_48);
    }
    pTVar4 = Builder::
             makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                        auStack_68);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)elements.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
    return (Expression *)pTVar4;
  }
  __assert_fail("type.isTuple()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x612,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleMake(Type type) {
  assert(wasm.features.hasMultivalue());
  assert(type.isTuple());
  std::vector<Expression*> elements;
  for (const auto& t : type) {
    elements.push_back(make(t));
  }
  return builder.makeTupleMake(std::move(elements));
}